

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doge.cpp
# Opt level: O2

int main(void)

{
  cake_iterator<false> __last1;
  cake_iterator<false> __first2;
  undefined1 auVar1 [16];
  undefined1 auVar2 [24];
  ostream *poVar3;
  int i;
  int iVar4;
  skiplist<int,_std::less<int>_> s1;
  skiplist<int,_std::less<int>_> s2;
  undefined8 in_stack_ffffffffffffeb70;
  int iVar5;
  uint7 in_stack_ffffffffffffeb81;
  SLNode<int> *in_stack_ffffffffffffeb90;
  SLNode<int> *local_1460;
  iterator local_1458;
  iterator local_1440;
  skiplist<int,_std::less<int>_> local_1428;
  skiplist<int,_std::less<int>_> local_a20;
  
  skiplist<int,_std::less<int>_>::skiplist(&local_1428);
  skiplist<int,_std::less<int>_>::skiplist(&local_a20);
  for (iVar4 = 0; iVar4 != 10; iVar4 = iVar4 + 1) {
    skiplist<int,_std::less<int>_>::insert(&local_1428,iVar4);
    skiplist<int,_std::less<int>_>::insert(&local_a20,iVar4);
  }
  *(uint *)(memmove + *(long *)(std::cout + -0x18)) =
       *(uint *)(memmove + *(long *)(std::cout + -0x18)) | 1;
  skiplist<int,_std::less<int>_>::begin(&local_1440,&local_1428);
  skiplist<int,_std::less<int>_>::begin(&local_1458,&local_a20);
  auVar2._8_8_ = local_1458._8_8_;
  auVar2._0_4_ = local_1458.node_count_;
  auVar2._4_4_ = local_1458.node_count_ref_;
  auVar2._16_8_ = 0;
  __last1._8_8_ = in_stack_ffffffffffffeb70;
  __last1._0_8_ = local_1458.node;
  __last1.node = (SLNode<int> *)0x0;
  auVar1 = ZEXT716(in_stack_ffffffffffffeb81) << 8;
  __first2.node = in_stack_ffffffffffffeb90;
  __first2.node_count_ = auVar1._0_4_;
  __first2.node_count_ref_ = auVar1._4_4_;
  __first2.reverse_ = (bool)auVar1[8];
  __first2._9_7_ = auVar1._9_7_;
  std::__equal<false>::
  equal<skiplist<int,std::less<int>>::cake_iterator<false>,skiplist<int,std::less<int>>::cake_iterator<false>>
            ((cake_iterator<false>)(auVar2 << 0x40),__last1,__first2);
  poVar3 = std::ostream::_M_insert<bool>(true);
  std::operator<<(poVar3,"\n");
  skiplist<int,_std::less<int>_>::begin((iterator *)&stack0xffffffffffffeb90,&local_1428);
  iVar4 = (int)in_stack_ffffffffffffeb90;
  iVar5 = (int)((ulong)in_stack_ffffffffffffeb90 >> 0x20);
  while( true ) {
    if (iVar4 == 0 && local_1460 == (SLNode<int> *)0x0) break;
    poVar3 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cout,
                        (local_1460->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[(long)iVar5 - (long)iVar4]);
    std::operator<<(poVar3,"\t");
    skiplist<int,_std::less<int>_>::cake_iterator<false>::operator++
              ((cake_iterator<false> *)&stack0xffffffffffffeb78);
  }
  skiplist<int,_std::less<int>_>::~skiplist(&local_a20);
  skiplist<int,_std::less<int>_>::~skiplist(&local_1428);
  return 0;
}

Assistant:

int main() {
	skiplist<int> s1;
	skiplist<int> s2;

	for(int i = 0; i < 10; ++i) {
		s1.insert(i);
		s2.insert(i);
	}

	std::cout << std::boolalpha;
	std::cout << std::equal(begin(s1), end(s1), begin(s2)) << "\n";

	// for_each
	std::for_each(begin(s1), end(s1), [](int e) { std::cout << e << "\t"; });
}